

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4CopyPalCommand::Execute
          (DrawColumnRt4CopyPalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int pitch;
  int count;
  int *dest;
  int *source;
  DrawerThread *thread_local;
  DrawColumnRt4CopyPalCommand *this_local;
  
  uVar2 = DrawerThread::count_for_thread
                    (thread,(this->super_PalRtCommand).yl,
                     ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)uVar2) {
    iVar4 = (this->super_PalRtCommand).yl;
    iVar3 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _pitch = (int *)((this->super_PalRtCommand)._destorg +
                    (*(int *)(ylookup + (long)(iVar4 + iVar3) * 4) + (this->super_PalRtCommand).sx))
    ;
    puVar1 = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = (int *)(puVar1 + (iVar4 << 2));
    iVar4 = (int)((ulong)(long)((this->super_PalRtCommand)._pitch * thread->num_cores) >> 2);
    if ((uVar2 & 1) != 0) {
      *_pitch = *dest;
      dest = dest + 1;
      _pitch = _pitch + iVar4;
    }
    for (iVar3 = (int)uVar2 >> 1; iVar3 != 0; iVar3 = iVar3 + -1) {
      *_pitch = *dest;
      _pitch[iVar4] = dest[1];
      dest = dest + 2;
      _pitch = _pitch + (iVar4 << 1);
    }
  }
  return;
}

Assistant:

void DrawColumnRt4CopyPalCommand::Execute(DrawerThread *thread)
	{
		int *source;
		int *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = (int *)(ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg);
		source = (int *)(&thread->dc_temp[thread->temp_line_for_thread(yl)*4]);
		pitch = _pitch*thread->num_cores/sizeof(int);
	
		if (count & 1) {
			*dest = *source;
			source += 4/sizeof(int);
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4/sizeof(int)];
			source += 8/sizeof(int);
			dest += pitch*2;
		} while (--count);
	}